

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmFormatterLog::open_log_file(CVmFormatterLog *this,vm_val_t *filespec,vm_rcdesc *rc)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined4 extraout_var;
  vm_globalvar_t *pvVar6;
  int in_EDX;
  char *in_RSI;
  CVmObjTable *in_RDI;
  int err;
  err_frame_t err_cur__;
  CVmNetFile *nf;
  CVmNetFile *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  CVmFormatterLog *this_00;
  uint local_100 [2];
  CVmFormatterLog *local_f8;
  CVmNetFile *local_f0;
  __jmp_buf_tag _Stack_e8;
  long local_20;
  int local_18;
  char *local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_20 = 0;
  local_10 = in_RSI;
  local_18 = in_EDX;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_f8 = (CVmFormatterLog *)*puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_100;
  local_100[0] = _setjmp(&_Stack_e8);
  if (local_100[0] == 0) {
    iVar2 = CVmNetFile::open(local_10,local_18,0xe,2,"text/plain");
    local_20 = CONCAT44(extraout_var,iVar2);
    CVmObjFile::check_safety_for_open((CVmNetFile *)in_RDI,iVar3);
  }
  if ((local_100[0] == 1) && (local_100[0] = 2, local_20 != 0)) {
    CVmNetFile::abandon(in_stack_fffffffffffffee0);
    err_rethrow();
  }
  this_00 = local_f8;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = this_00;
  if ((local_100[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    in_stack_fffffffffffffee0 = local_f0;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(CVmNetFile **)(*plVar5 + 0x10) = in_stack_fffffffffffffee0;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  iVar3 = open_log_file(this_00,in_stack_fffffffffffffee0);
  if (iVar3 == 0) {
    lVar1._0_4_ = in_RDI[0x1e0].gc_queue_head_;
    lVar1._4_4_ = in_RDI[0x1e0].finalize_queue_head_;
    if (lVar1 == 0) {
      pvVar6 = CVmObjTable::create_global_var(in_RDI);
      *(vm_globalvar_t **)&in_RDI[0x1e0].gc_queue_head_ = pvVar6;
    }
    puVar4 = *(undefined8 **)&in_RDI[0x1e0].gc_queue_head_;
    *puVar4 = *(undefined8 *)local_10;
    puVar4[1] = *(undefined8 *)(local_10 + 8);
  }
  return iVar3;
}

Assistant:

int CVmFormatterLog::open_log_file(VMG_ const vm_val_t *filespec,
                                   const struct vm_rcdesc *rc)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(vmg_ filespec, rc,
                              NETF_NEW, OSFTLOG, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_WRITE);
    }